

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O2

void duckdb::GZipFileSystem::VerifyGZIPHeader
               (uint8_t *gzip_hdr,idx_t read_count,
               optional_ptr<duckdb::CompressedFile,_true> source_file)

{
  CompressedFile *pCVar1;
  IOException *pIVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string file_info;
  optional_ptr<duckdb::CompressedFile,_true> source_file_local;
  
  source_file_local = source_file;
  if (source_file.ptr == (CompressedFile *)0x0) {
    ::std::__cxx11::string::string
              ((string *)&file_info,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_60);
  }
  else {
    pCVar1 = optional_ptr<duckdb::CompressedFile,_true>::operator->(&source_file_local);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_info
                     ,": ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &(pCVar1->super_FileHandle).path);
  }
  if (read_count != 10) {
    pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_60,"Input is not a GZIP stream",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_info
                    );
    IOException::IOException(pIVar2,(string *)&local_60);
    __cxa_throw(pIVar2,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((*gzip_hdr != '\x1f') || (gzip_hdr[1] != 0x8b)) {
    pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_60,"Input is not a GZIP stream",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_info
                    );
    IOException::IOException(pIVar2,(string *)&local_60);
    __cxa_throw(pIVar2,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (gzip_hdr[2] != '\b') {
    pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_60,"Unsupported GZIP compression method",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_info
                    );
    IOException::IOException(pIVar2,(string *)&local_60);
    __cxa_throw(pIVar2,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((gzip_hdr[3] & 0x33) == 0) {
    ::std::__cxx11::string::~string((string *)&file_info);
    return;
  }
  pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_60,"Unsupported GZIP archive",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_info);
  IOException::IOException(pIVar2,(string *)&local_60);
  __cxa_throw(pIVar2,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void GZipFileSystem::VerifyGZIPHeader(uint8_t gzip_hdr[], idx_t read_count, optional_ptr<CompressedFile> source_file) {
	// include the filename in the error message if known
	string file_info = source_file ? ": " + source_file->path : "";

	// check for incorrectly formatted files
	if (read_count != GZIP_HEADER_MINSIZE) {
		throw IOException("Input is not a GZIP stream" + file_info);
	}
	if (gzip_hdr[0] != 0x1F || gzip_hdr[1] != 0x8B) { // magic header
		throw IOException("Input is not a GZIP stream" + file_info);
	}
	if (gzip_hdr[2] != GZIP_COMPRESSION_DEFLATE) { // compression method
		throw IOException("Unsupported GZIP compression method" + file_info);
	}
	if (gzip_hdr[3] & GZIP_FLAG_UNSUPPORTED) {
		throw IOException("Unsupported GZIP archive" + file_info);
	}
}